

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cc
# Opt level: O1

void __thiscall
re2c::MatchOp::split
          (MatchOp *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *cs)

{
  undefined8 in_RAX;
  Range *pRVar1;
  undefined8 local_28;
  
  pRVar1 = this->match;
  if (pRVar1 != (Range *)0x0) {
    local_28 = in_RAX;
    do {
      local_28._4_4_ = pRVar1->lb;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_insert_unique<unsigned_int>(&cs->_M_t,(uint *)((long)&local_28 + 4));
      local_28 = CONCAT44(local_28._4_4_,pRVar1->ub);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_insert_unique<unsigned_int>(&cs->_M_t,(uint *)&local_28);
      pRVar1 = pRVar1->nx;
    } while (pRVar1 != (Range *)0x0);
  }
  return;
}

Assistant:

void MatchOp::split (std::set<uint32_t> & cs)
{
	for (Range *r = match; r; r = r->next ())
	{
		cs.insert (r->lower ());
		cs.insert (r->upper ());
	}
}